

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

GPU_ShaderBlock
GPU_LoadShaderBlock(Uint32 program_object,char *position_name,char *texcoord_name,char *color_name,
                   char *modelViewMatrix_name)

{
  GPU_ShaderBlock GVar1;
  GPU_ShaderBlock GVar2;
  
  GVar1.color_loc = -1;
  GVar1.modelViewProjection_loc = -1;
  GVar1.position_loc = -1;
  GVar1.texcoord_loc = -1;
  if (_gpu_current_renderer != (GPU_Renderer *)0x0) {
    if (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0) {
      GVar1 = (*_gpu_current_renderer->impl->LoadShaderBlock)
                        (_gpu_current_renderer,program_object,position_name,texcoord_name,color_name
                         ,modelViewMatrix_name);
    }
    return GVar1;
  }
  GVar2.color_loc = -1;
  GVar2.modelViewProjection_loc = -1;
  GVar2.position_loc = -1;
  GVar2.texcoord_loc = -1;
  return GVar2;
}

Assistant:

GPU_ShaderBlock GPU_LoadShaderBlock(Uint32 program_object, const char* position_name, const char* texcoord_name, const char* color_name, const char* modelViewMatrix_name)
{
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
    {
        GPU_ShaderBlock b;
        b.position_loc = -1;
        b.texcoord_loc = -1;
        b.color_loc = -1;
        b.modelViewProjection_loc = -1;
        return b;
    }

    return _gpu_current_renderer->impl->LoadShaderBlock(_gpu_current_renderer, program_object, position_name, texcoord_name, color_name, modelViewMatrix_name);
}